

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Key(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
      *this,Ch *str,SizeType len,bool copy)

{
  bool bVar1;
  SchemaType *this_00;
  Context *context_00;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar2;
  bool local_71;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_70;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_60;
  uint local_38;
  uint local_34;
  SizeType i__1;
  SizeType i_;
  Context *context;
  bool copy_local;
  SizeType len_local;
  Ch *str_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  if ((this->valid_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    AppendToken(this,str,len);
    this_00 = CurrentSchema(this);
    context_00 = CurrentContext(this);
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::Key(this_00,context_00,str,len,copy);
    if ((bVar1) || (bVar1 = GetContinueOnErrors(this), bVar1)) {
      for (_i__1 = internal::Stack<rapidjson::CrtAllocator>::
                   Bottom<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                             (&this->schemaStack_);
          pSVar2 = internal::Stack<rapidjson::CrtAllocator>::
                   End<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                             (&this->schemaStack_), _i__1 != pSVar2; _i__1 = _i__1 + 1) {
        if (_i__1->hasher != (void *)0x0) {
          internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Key
                    ((Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)_i__1->hasher,str,len
                     ,copy);
        }
        if (_i__1->validators != (ISchemaValidator **)0x0) {
          for (local_34 = 0; local_34 < _i__1->validatorCount; local_34 = local_34 + 1) {
            if (_i__1->validators[local_34] == (ISchemaValidator *)0x0) {
              local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                          *)0x0;
            }
            else {
              local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                          *)(_i__1->validators[local_34] + -1);
            }
            Key(local_60,str,len,copy);
          }
        }
        if (_i__1->patternPropertiesValidators != (ISchemaValidator **)0x0) {
          for (local_38 = 0; local_38 < _i__1->patternPropertiesValidatorCount;
              local_38 = local_38 + 1) {
            if (_i__1->patternPropertiesValidators[local_38] == (ISchemaValidator *)0x0) {
              local_70 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                          *)0x0;
            }
            else {
              local_70 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                          *)(_i__1->patternPropertiesValidators[local_38] + -1);
            }
            Key(local_70,str,len,copy);
          }
        }
      }
      local_71 = true;
      if (this->outputHandler_ != (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0) {
        local_71 = BaseReaderHandler<rapidjson::UTF8<char>,_void>::Key
                             (this->outputHandler_,str,len,copy);
      }
      this->valid_ = local_71;
      this_local._7_1_ = (bool)(this->valid_ & 1);
    }
    else {
      this->valid_ = false;
      this_local._7_1_ = (bool)(this->valid_ & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Key(const Ch* str, SizeType len, bool copy) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::Key", str);
        if (!valid_) return false;
        AppendToken(str, len);
        if (!CurrentSchema().Key(CurrentContext(), str, len, copy) && !GetContinueOnErrors()) {
            valid_ = false;
            return valid_;
        }
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(Key, (str, len, copy));
        valid_ = !outputHandler_ || outputHandler_->Key(str, len, copy);
        return valid_;
    }